

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O0

string * duckdb::ParseString(Value *value,string *loption)

{
  bool bVar1;
  LogicalTypeId LVar2;
  LogicalType *pLVar3;
  string *loption_00;
  size_type sVar4;
  undefined8 uVar5;
  Value *in_RDX;
  Value *in_RSI;
  string *in_RDI;
  vector<duckdb::Value,_true> *children;
  Value *in_stack_fffffffffffffef8;
  vector<duckdb::Value,_true> *in_stack_ffffffffffffff00;
  string local_c8 [8];
  Value *in_stack_ffffffffffffff40;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  BinderException *in_stack_ffffffffffffff70;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  
  bVar1 = Value::IsNull(in_RSI);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    pLVar3 = Value::type(in_RSI);
    LVar2 = LogicalType::id(pLVar3);
    if (LVar2 == LIST) {
      loption_00 = (string *)ListValue::GetChildren(in_stack_ffffffffffffff40);
      sVar4 = ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::size
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)loption_00);
      if (sVar4 != 1) {
        uVar5 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_40,"\"%s\" expects a single argument as a string value",&local_41);
        ::std::__cxx11::string::string(local_78,(string *)in_RDX);
        BinderException::BinderException<std::__cxx11::string>
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
      }
      vector<duckdb::Value,_true>::operator[]
                (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
      ParseString(in_RDX,loption_00);
    }
    else {
      pLVar3 = Value::type(in_RSI);
      LVar2 = LogicalType::id(pLVar3);
      if (LVar2 != VARCHAR) {
        uVar5 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff60,"\"%s\" expects a string argument!",&local_a1)
        ;
        ::std::__cxx11::string::string(local_c8,(string *)in_RDX);
        BinderException::BinderException<std::__cxx11::string>
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
      }
      Value::GetValue<std::__cxx11::string>(in_stack_fffffffffffffef8);
    }
  }
  return in_RDI;
}

Assistant:

static string ParseString(const Value &value, const string &loption) {
	if (value.IsNull()) {
		return string();
	}
	if (value.type().id() == LogicalTypeId::LIST) {
		auto &children = ListValue::GetChildren(value);
		if (children.size() != 1) {
			throw BinderException("\"%s\" expects a single argument as a string value", loption);
		}
		return ParseString(children[0], loption);
	}
	if (value.type().id() != LogicalTypeId::VARCHAR) {
		throw BinderException("\"%s\" expects a string argument!", loption);
	}
	return value.GetValue<string>();
}